

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitByBoneCountProcess.cpp
# Opt level: O3

void __thiscall
Assimp::SplitByBoneCountProcess::Execute(SplitByBoneCountProcess *this,aiScene *pScene)

{
  pointer *ppuVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  iterator iVar3;
  byte bVar4;
  aiMesh *paVar5;
  byte bVar6;
  uint uVar7;
  Logger *pLVar8;
  aiMesh **__dest;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  aiMesh *srcMesh;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> newMeshes;
  uint local_1fc;
  void *local_1f8;
  iterator iStack_1f0;
  aiMesh **local_1e8;
  aiMesh *local_1d8 [2];
  undefined1 local_1c8 [32];
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_1a8 [4];
  ios_base local_138 [264];
  
  pLVar8 = DefaultLogger::get();
  Logger::debug(pLVar8,"SplitByBoneCountProcess begin");
  if ((ulong)pScene->mNumMeshes != 0) {
    uVar9 = 0;
    bVar6 = 0;
    do {
      bVar4 = bVar6;
      bVar12 = this->mMaxBoneCount < (ulong)pScene->mMeshes[uVar9]->mNumBones;
      uVar9 = uVar9 + 1;
      bVar6 = bVar4 | bVar12;
    } while (pScene->mNumMeshes != uVar9);
    if ((bool)(bVar4 | bVar12)) {
      this_00 = &this->mSubMeshIndices;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::clear(this_00);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::resize(this_00,(ulong)pScene->mNumMeshes);
      local_1f8 = (void *)0x0;
      iStack_1f0._M_current = (aiMesh **)0x0;
      local_1e8 = (aiMesh **)0x0;
      if (pScene->mNumMeshes == 0) {
        uVar7 = 0;
      }
      else {
        uVar9 = 0;
        local_1c8._16_8_ = pScene;
        local_1c8._24_8_ = this;
        do {
          local_1d8[0] = pScene->mMeshes[uVar9];
          local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          SplitMesh(this,pScene->mMeshes[uVar9],local_1a8);
          if (local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pvVar2 = (this_00->
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar9;
            local_1fc = (uint)((ulong)((long)iStack_1f0._M_current - (long)local_1f8) >> 3);
            iVar3._M_current =
                 (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(pvVar2,iVar3,&local_1fc);
            }
            else {
              *iVar3._M_current = local_1fc;
              ppuVar1 = &(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            if (iStack_1f0._M_current == local_1e8) {
              std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                        ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_1f8,iStack_1f0,local_1d8)
              ;
            }
            else {
              *iStack_1f0._M_current = local_1d8[0];
              iStack_1f0._M_current = iStack_1f0._M_current + 1;
            }
          }
          else {
            uVar10 = 0;
            uVar11 = 1;
            do {
              pvVar2 = (this_00->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar9;
              local_1fc = (uint)((ulong)((long)iStack_1f0._M_current - (long)local_1f8) >> 3);
              iVar3._M_current =
                   (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>(pvVar2,iVar3,&local_1fc);
              }
              else {
                *iVar3._M_current = local_1fc;
                ppuVar1 = &(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppuVar1 = *ppuVar1 + 1;
              }
              if (iStack_1f0._M_current == local_1e8) {
                std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                          ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_1f8,iStack_1f0,
                           (aiMesh **)
                           ((float *)local_1a8[0].
                                     super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                                     .super__Vector_impl_data._M_start + uVar10 * 2));
              }
              else {
                *iStack_1f0._M_current =
                     *(aiMesh **)
                      ((float *)local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar10 * 2);
                iStack_1f0._M_current = iStack_1f0._M_current + 1;
              }
              pScene = (aiScene *)local_1c8._16_8_;
              paVar5 = local_1d8[0];
              bVar12 = uVar11 < (ulong)((long)local_1a8[0].
                                              super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_1a8[0].
                                              super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 3);
              uVar10 = uVar11;
              uVar11 = (ulong)((int)uVar11 + 1);
            } while (bVar12);
            if (local_1d8[0] != (aiMesh *)0x0) {
              aiMesh::~aiMesh(local_1d8[0]);
            }
            operator_delete(paVar5);
            this = (SplitByBoneCountProcess *)local_1c8._24_8_;
          }
          if ((aiVector3D *)
              local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start != (aiVector3D *)0x0) {
            operator_delete(local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < pScene->mNumMeshes);
        uVar7 = (uint)((ulong)((long)iStack_1f0._M_current - (long)local_1f8) >> 3);
      }
      pScene->mNumMeshes = uVar7;
      if (pScene->mMeshes != (aiMesh **)0x0) {
        operator_delete__(pScene->mMeshes);
        uVar7 = pScene->mNumMeshes;
      }
      __dest = (aiMesh **)operator_new__((ulong)uVar7 << 3);
      pScene->mMeshes = __dest;
      if ((long)iStack_1f0._M_current - (long)local_1f8 != 0) {
        memmove(__dest,local_1f8,(long)iStack_1f0._M_current - (long)local_1f8);
      }
      UpdateNode(this,pScene->mRootNode);
      pLVar8 = DefaultLogger::get();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"SplitByBoneCountProcess end: split ",0x23);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," meshes into ",0xd);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," submeshes.",0xb);
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar8,(char *)local_1d8[0]);
      if (local_1d8[0] != (aiMesh *)local_1c8) {
        operator_delete(local_1d8[0]);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if (local_1f8 == (void *)0x0) {
        return;
      }
      operator_delete(local_1f8);
      return;
    }
  }
  pLVar8 = DefaultLogger::get();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"SplitByBoneCountProcess early-out: no meshes with more than ",
             0x3c);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," bones.",7);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar8,(char *)local_1d8[0]);
  if (local_1d8[0] != (aiMesh *)local_1c8) {
    operator_delete(local_1d8[0]);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void SplitByBoneCountProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("SplitByBoneCountProcess begin");

    // early out
    bool isNecessary = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a)
        if( pScene->mMeshes[a]->mNumBones > mMaxBoneCount )
            isNecessary = true;

    if( !isNecessary )
    {
        ASSIMP_LOG_DEBUG( format() << "SplitByBoneCountProcess early-out: no meshes with more than " << mMaxBoneCount << " bones." );
        return;
    }

    // we need to do something. Let's go.
    mSubMeshIndices.clear();
    mSubMeshIndices.resize( pScene->mNumMeshes);

    // build a new array of meshes for the scene
    std::vector<aiMesh*> meshes;

    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a)
    {
        aiMesh* srcMesh = pScene->mMeshes[a];

        std::vector<aiMesh*> newMeshes;
        SplitMesh( pScene->mMeshes[a], newMeshes);

        // mesh was split
        if( !newMeshes.empty() )
        {
            // store new meshes and indices of the new meshes
            for( unsigned int b = 0; b < newMeshes.size(); ++b)
            {
                mSubMeshIndices[a].push_back( static_cast<unsigned int>(meshes.size()));
                meshes.push_back( newMeshes[b]);
            }

            // and destroy the source mesh. It should be completely contained inside the new submeshes
            delete srcMesh;
        }
        else
        {
            // Mesh is kept unchanged - store it's new place in the mesh array
            mSubMeshIndices[a].push_back( static_cast<unsigned int>(meshes.size()));
            meshes.push_back( srcMesh);
        }
    }

    // rebuild the scene's mesh array
    pScene->mNumMeshes = static_cast<unsigned int>(meshes.size());
    delete [] pScene->mMeshes;
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    std::copy( meshes.begin(), meshes.end(), pScene->mMeshes);

    // recurse through all nodes and translate the node's mesh indices to fit the new mesh array
    UpdateNode( pScene->mRootNode);

    ASSIMP_LOG_DEBUG( format() << "SplitByBoneCountProcess end: split " << mSubMeshIndices.size() << " meshes into " << meshes.size() << " submeshes." );
}